

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                   (string *__return_storage_ptr__,int *arg,char (*args) [5],int *args_1,
                   char (*args_2) [8],int *args_3,char (*args_4) [4])

{
  string local_70;
  string local_50;
  
  StringBuilder<int>(&local_50,arg);
  StringBuilder<char[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
            (&local_70,args,args_1,args_2,args_3,args_4);
  std::operator+(__return_storage_ptr__,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}